

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# colormapper.h
# Opt level: O3

int __thiscall irwincolor::Map::load(Map *this,string *file,string *name)

{
  string *psVar1;
  double dVar2;
  pointer pdVar3;
  iterator iVar4;
  char *pcVar5;
  double *pdVar6;
  undefined1 auVar7 [16];
  char cVar8;
  bool bVar9;
  int iVar10;
  ostream *poVar11;
  reference pvVar12;
  ulong uVar13;
  long *plVar14;
  xml_attribute xVar15;
  const_iterator cVar16;
  char_t *pcVar17;
  unspecified_bool_type p_Var18;
  int *piVar19;
  undefined8 *puVar20;
  undefined8 uVar21;
  ulong uVar22;
  xml_node_struct *pxVar23;
  long lVar24;
  long lVar25;
  uint uVar26;
  double dVar27;
  undefined1 auVar28 [12];
  vector<float,_std::allocator<float>_> xrgb;
  vector<double,_std::allocator<double>_> tmp;
  json inj;
  xml_node point;
  string ext;
  vector<unsigned_int,_std::allocator<unsigned_int>_> idxc;
  allocator<char> local_311;
  xml_attribute local_310;
  xml_node_struct *local_308;
  undefined1 local_300 [24];
  xml_attribute local_2e8;
  xml_attribute local_2e0;
  undefined1 local_2d8 [32];
  undefined1 local_2b8 [32];
  string *local_298;
  xml_node local_290;
  vector<double,_std::allocator<double>_> *local_288;
  vector<double,_std::allocator<double>_> *local_280;
  vector<double,_std::allocator<double>_> *local_278;
  double *local_270;
  xpath_node local_268;
  long *local_258;
  long local_250;
  long local_248 [2];
  undefined1 local_238 [520];
  
  pdVar3 = (this->x).super__Vector_base<double,_std::allocator<double>_>._M_impl.
           super__Vector_impl_data._M_start;
  if ((this->x).super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
      _M_finish != pdVar3) {
    (this->x).super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
    _M_finish = pdVar3;
  }
  pdVar3 = (this->r).super__Vector_base<double,_std::allocator<double>_>._M_impl.
           super__Vector_impl_data._M_start;
  if ((this->r).super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
      _M_finish != pdVar3) {
    (this->r).super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
    _M_finish = pdVar3;
  }
  pdVar3 = (this->g).super__Vector_base<double,_std::allocator<double>_>._M_impl.
           super__Vector_impl_data._M_start;
  if ((this->g).super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
      _M_finish != pdVar3) {
    (this->g).super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
    _M_finish = pdVar3;
  }
  pdVar3 = (this->b).super__Vector_base<double,_std::allocator<double>_>._M_impl.
           super__Vector_impl_data._M_start;
  if ((this->b).super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
      _M_finish != pdVar3) {
    (this->b).super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
    _M_finish = pdVar3;
  }
  psVar1 = &this->space;
  this->nanr = 0.0;
  this->nang = 0.0;
  this->nanb = 0.0;
  local_298 = name;
  std::__cxx11::string::_M_replace((ulong)psVar1,0,(char *)(this->space)._M_string_length,0x14ad1d);
  this->paraView = true;
  std::__cxx11::string::find_last_of((char *)file,0x142879,0xffffffffffffffff);
  std::__cxx11::string::substr((ulong)&local_258,(ulong)file);
  local_278 = &this->r;
  local_280 = &this->g;
  local_288 = &this->b;
  local_270 = &this->nanr;
  iVar10 = std::__cxx11::string::compare((char *)&local_258);
  if (iVar10 == 0) {
    pugi::xml_document::xml_document((xml_document *)local_238);
    iVar10 = loadXml(file,(xml_document *)local_238);
    if (iVar10 != 0) {
      pugi::xml_document::~xml_document((xml_document *)local_238);
      local_300._16_4_ = 1;
      goto LAB_0010970d;
    }
    local_300._16_8_ = (ulong)(uint)local_300._20_4_ << 0x20;
    local_2d8._0_8_ = local_2d8 + 0x10;
    local_2d8._8_8_ = (object_t *)0x0;
    local_2d8._16_8_ = local_2d8._16_8_ & 0xffffffffffffff00;
    pugi::xpath_node::xpath_node(&local_268);
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_2b8,
                   "/ColorMaps/ColorMap[@name=\'",local_298);
    plVar14 = (long *)std::__cxx11::string::append(local_2b8);
    pxVar23 = (xml_node_struct *)(plVar14 + 2);
    if ((xml_node_struct *)*plVar14 == pxVar23) {
      local_300._0_8_ = pxVar23->header;
      local_300._8_8_ = plVar14[3];
      local_310._attr = (xml_attribute_struct *)local_300;
    }
    else {
      local_300._0_8_ = pxVar23->header;
      local_310._attr = (xml_attribute_struct *)*plVar14;
    }
    local_308 = (xml_node_struct *)plVar14[1];
    *plVar14 = (long)pxVar23;
    plVar14[1] = 0;
    *(undefined1 *)(plVar14 + 2) = 0;
    std::__cxx11::string::operator=((string *)local_2d8,(string *)&local_310);
    if ((xml_node_struct *)local_310._attr != (xml_node_struct *)local_300) {
      operator_delete(local_310._attr,local_300._0_8_ + 1);
    }
    if ((xml_node_struct *)local_2b8._0_8_ != (xml_node_struct *)(local_2b8 + 0x10)) {
      operator_delete((void *)local_2b8._0_8_,local_2b8._16_8_ + 1);
    }
    local_268 = pugi::xml_node::select_node
                          ((xml_node *)local_238,(char_t *)local_2d8._0_8_,(xpath_variable_set *)0x0
                          );
    bVar9 = pugi::xpath_node::operator!(&local_268);
    if (bVar9) {
LAB_00109472:
      puVar20 = (undefined8 *)__cxa_allocate_exception(8);
      *puVar20 = &PTR__exception_0015ca50;
      __cxa_throw(puVar20,&XPathException::typeinfo,std::exception::~exception);
    }
    local_290 = pugi::xpath_node::node(&local_268);
    local_2b8._0_8_ = pugi::xml_node::parent(&local_290);
    local_310 = pugi::xml_node::attribute((xml_node *)local_2b8,"space");
    pcVar17 = pugi::xml_attribute::value(&local_310);
    pcVar5 = (char *)(this->space)._M_string_length;
    strlen(pcVar17);
    std::__cxx11::string::_M_replace((ulong)psVar1,0,pcVar5,(ulong)pcVar17);
    local_290 = pugi::xpath_node::node(&local_268);
    uVar21 = local_300._16_8_;
    local_300._17_3_ = SUB83(local_300._16_8_,1);
    local_300[0x10] = iVar10 != 0;
    local_300._20_4_ = SUB84(uVar21,4);
    while (p_Var18 = pugi::xml_node::operator_cast_to_function_pointer(&local_290),
          p_Var18 != (unspecified_bool_type)0x0) {
      local_2e8 = pugi::xml_node::attribute(&local_290,"x");
      pcVar17 = pugi::xml_attribute::value(&local_2e8);
      std::__cxx11::string::string<std::allocator<char>>((string *)&local_310,pcVar17,&local_311);
      xVar15._attr = local_310._attr;
      piVar19 = __errno_location();
      iVar10 = *piVar19;
      *piVar19 = 0;
      pxVar23 = (xml_node_struct *)strtod((char *)xVar15._attr,(char **)local_2b8);
      if ((xml_attribute_struct *)local_2b8._0_8_ == xVar15._attr) {
        std::__throw_invalid_argument("stod");
LAB_0010941e:
        std::__throw_invalid_argument("stod");
LAB_0010942a:
        std::__throw_invalid_argument("stod");
LAB_00109436:
        std::__throw_invalid_argument("stod");
LAB_00109442:
        std::__throw_out_of_range("stod");
LAB_0010944e:
        std::__throw_out_of_range("stod");
LAB_0010945a:
        std::__throw_out_of_range("stod");
LAB_00109466:
        std::__throw_out_of_range("stod");
        goto LAB_00109472;
      }
      if (*piVar19 != 0) {
        if (*piVar19 != 0x22) goto LAB_00108b93;
        goto LAB_0010944e;
      }
      *piVar19 = iVar10;
LAB_00108b93:
      iVar4._M_current =
           (this->x).super__Vector_base<double,_std::allocator<double>_>._M_impl.
           super__Vector_impl_data._M_finish;
      local_2e0._attr = (xml_attribute_struct *)pxVar23;
      if (iVar4._M_current ==
          (this->x).super__Vector_base<double,_std::allocator<double>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage) {
        std::vector<double,_std::allocator<double>_>::_M_realloc_insert<double>
                  (&this->x,iVar4,(double *)&local_2e0);
      }
      else {
        *iVar4._M_current = (double)pxVar23;
        (this->x).super__Vector_base<double,_std::allocator<double>_>._M_impl.
        super__Vector_impl_data._M_finish = iVar4._M_current + 1;
      }
      if ((xml_node_struct *)local_310._attr != (xml_node_struct *)local_300) {
        operator_delete(local_310._attr,local_300._0_8_ + 1);
      }
      local_2e8 = pugi::xml_node::attribute(&local_290,"r");
      pcVar17 = pugi::xml_attribute::value(&local_2e8);
      std::__cxx11::string::string<std::allocator<char>>((string *)&local_310,pcVar17,&local_311);
      xVar15._attr = local_310._attr;
      iVar10 = *piVar19;
      *piVar19 = 0;
      pxVar23 = (xml_node_struct *)strtod((char *)local_310._attr,(char **)local_2b8);
      if ((xml_attribute_struct *)local_2b8._0_8_ == xVar15._attr) goto LAB_0010941e;
      if (*piVar19 != 0) {
        if (*piVar19 != 0x22) goto LAB_00108c47;
        goto LAB_00109466;
      }
      *piVar19 = iVar10;
LAB_00108c47:
      iVar4._M_current =
           (this->r).super__Vector_base<double,_std::allocator<double>_>._M_impl.
           super__Vector_impl_data._M_finish;
      local_2e0._attr = (xml_attribute_struct *)pxVar23;
      if (iVar4._M_current ==
          (this->r).super__Vector_base<double,_std::allocator<double>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage) {
        std::vector<double,_std::allocator<double>_>::_M_realloc_insert<double>
                  (local_278,iVar4,(double *)&local_2e0);
      }
      else {
        *iVar4._M_current = (double)pxVar23;
        (this->r).super__Vector_base<double,_std::allocator<double>_>._M_impl.
        super__Vector_impl_data._M_finish = iVar4._M_current + 1;
      }
      if ((xml_node_struct *)local_310._attr != (xml_node_struct *)local_300) {
        operator_delete(local_310._attr,local_300._0_8_ + 1);
      }
      local_2e8 = pugi::xml_node::attribute(&local_290,"g");
      pcVar17 = pugi::xml_attribute::value(&local_2e8);
      std::__cxx11::string::string<std::allocator<char>>((string *)&local_310,pcVar17,&local_311);
      xVar15._attr = local_310._attr;
      iVar10 = *piVar19;
      *piVar19 = 0;
      pxVar23 = (xml_node_struct *)strtod((char *)local_310._attr,(char **)local_2b8);
      if ((xml_attribute_struct *)local_2b8._0_8_ == xVar15._attr) goto LAB_0010942a;
      if (*piVar19 != 0) {
        if (*piVar19 != 0x22) goto LAB_00108d00;
        goto LAB_0010945a;
      }
      *piVar19 = iVar10;
LAB_00108d00:
      iVar4._M_current =
           (this->g).super__Vector_base<double,_std::allocator<double>_>._M_impl.
           super__Vector_impl_data._M_finish;
      local_2e0._attr = (xml_attribute_struct *)pxVar23;
      if (iVar4._M_current ==
          (this->g).super__Vector_base<double,_std::allocator<double>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage) {
        std::vector<double,_std::allocator<double>_>::_M_realloc_insert<double>
                  (local_280,iVar4,(double *)&local_2e0);
      }
      else {
        *iVar4._M_current = (double)pxVar23;
        (this->g).super__Vector_base<double,_std::allocator<double>_>._M_impl.
        super__Vector_impl_data._M_finish = iVar4._M_current + 1;
      }
      if ((xml_node_struct *)local_310._attr != (xml_node_struct *)local_300) {
        operator_delete(local_310._attr,local_300._0_8_ + 1);
      }
      local_2e8 = pugi::xml_node::attribute(&local_290,"b");
      pcVar17 = pugi::xml_attribute::value(&local_2e8);
      std::__cxx11::string::string<std::allocator<char>>((string *)&local_310,pcVar17,&local_311);
      xVar15._attr = local_310._attr;
      iVar10 = *piVar19;
      *piVar19 = 0;
      pxVar23 = (xml_node_struct *)strtod((char *)local_310._attr,(char **)local_2b8);
      if ((xml_attribute_struct *)local_2b8._0_8_ == xVar15._attr) goto LAB_00109436;
      if (*piVar19 == 0) {
        *piVar19 = iVar10;
      }
      else if (*piVar19 == 0x22) goto LAB_00109442;
      iVar4._M_current =
           (this->b).super__Vector_base<double,_std::allocator<double>_>._M_impl.
           super__Vector_impl_data._M_finish;
      local_2e0._attr = (xml_attribute_struct *)pxVar23;
      if (iVar4._M_current ==
          (this->b).super__Vector_base<double,_std::allocator<double>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage) {
        std::vector<double,_std::allocator<double>_>::_M_realloc_insert<double>
                  (local_288,iVar4,(double *)&local_2e0);
      }
      else {
        *iVar4._M_current = (double)pxVar23;
        (this->b).super__Vector_base<double,_std::allocator<double>_>._M_impl.
        super__Vector_impl_data._M_finish = iVar4._M_current + 1;
      }
      if ((xml_node_struct *)local_310._attr != (xml_node_struct *)local_300) {
        operator_delete(local_310._attr,local_300._0_8_ + 1);
      }
      local_290 = pugi::xml_node::next_sibling(&local_290,"Point");
    }
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_2b8,
                   "/ColorMaps/ColorMap[@name=\'",local_298);
    plVar14 = (long *)std::__cxx11::string::append(local_2b8);
    pxVar23 = (xml_node_struct *)(plVar14 + 2);
    if ((xml_node_struct *)*plVar14 == pxVar23) {
      local_300._0_8_ = pxVar23->header;
      local_300._8_8_ = plVar14[3];
      local_310._attr = (xml_attribute_struct *)local_300;
    }
    else {
      local_300._0_8_ = pxVar23->header;
      local_310._attr = (xml_attribute_struct *)*plVar14;
    }
    local_308 = (xml_node_struct *)plVar14[1];
    *plVar14 = (long)pxVar23;
    plVar14[1] = 0;
    *(undefined1 *)(plVar14 + 2) = 0;
    std::__cxx11::string::operator=((string *)local_2d8,(string *)&local_310);
    if ((xml_node_struct *)local_310._attr != (xml_node_struct *)local_300) {
      operator_delete(local_310._attr,local_300._0_8_ + 1);
    }
    if ((xml_node_struct *)local_2b8._0_8_ != (xml_node_struct *)(local_2b8 + 0x10)) {
      operator_delete((void *)local_2b8._0_8_,local_2b8._16_8_ + 1);
    }
    local_268 = pugi::xml_node::select_node
                          ((xml_node *)local_238,(char_t *)local_2d8._0_8_,(xpath_variable_set *)0x0
                          );
    bVar9 = pugi::xpath_node::operator!(&local_268);
    if (bVar9) {
      puVar20 = (undefined8 *)__cxa_allocate_exception(8);
      *puVar20 = &PTR__exception_0015ca50;
      __cxa_throw(puVar20,&XPathException::typeinfo,std::exception::~exception);
    }
    local_290 = pugi::xpath_node::node(&local_268);
    local_2e0 = pugi::xml_node::attribute(&local_290,"r");
    pcVar17 = pugi::xml_attribute::value(&local_2e0);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_310,pcVar17,(allocator<char> *)&local_2e8);
    xVar15._attr = local_310._attr;
    piVar19 = __errno_location();
    iVar10 = *piVar19;
    *piVar19 = 0;
    dVar27 = strtod((char *)xVar15._attr,(char **)local_2b8);
    if ((xml_attribute_struct *)local_2b8._0_8_ == xVar15._attr) {
      std::__throw_invalid_argument("stod");
LAB_001094d4:
      std::__throw_invalid_argument("stod");
LAB_001094e0:
      cVar8 = (char)xVar15._attr;
      auVar28 = std::__throw_invalid_argument("stod");
      iVar10 = auVar28._8_4_;
      uVar21 = auVar28._0_8_;
      if (iVar10 == 2) {
        __cxa_begin_catch(uVar21);
        __cxa_end_catch();
      }
      else {
        if (iVar10 != 1) {
          if ((xml_node_struct *)local_310._attr != (xml_node_struct *)0x0) {
            operator_delete(local_310._attr,local_300._0_8_ - (long)local_310._attr);
          }
          nlohmann::
          basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
          ::~basic_json((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                         *)local_2b8);
          std::ifstream::~ifstream(local_238);
          if (local_258 != local_248) {
            operator_delete(local_258,local_248[0] + 1);
          }
          if ((iVar10 != 2) && (iVar10 != 1)) {
            _Unwind_Resume(uVar21);
          }
          __cxa_begin_catch(uVar21);
          __cxa_end_catch();
          return 0;
        }
        __cxa_begin_catch(uVar21);
        __cxa_end_catch();
      }
LAB_001089a9:
      if ((xml_node_struct *)local_310._attr != (xml_node_struct *)0x0) {
        operator_delete(local_310._attr,local_300._0_8_ - (long)local_310._attr);
      }
      goto LAB_001089c0;
    }
    if (*piVar19 == 0) {
LAB_00108f8c:
      *piVar19 = iVar10;
    }
    else if (*piVar19 == 0x22) {
      dVar27 = (double)std::__throw_out_of_range("stod");
      goto LAB_00108f8c;
    }
    *local_270 = dVar27;
    if ((xml_node_struct *)local_310._attr != (xml_node_struct *)local_300) {
      operator_delete(local_310._attr,local_300._0_8_ + 1);
    }
    local_2e0 = pugi::xml_node::attribute(&local_290,"g");
    pcVar17 = pugi::xml_attribute::value(&local_2e0);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_310,pcVar17,(allocator<char> *)&local_2e8);
    xVar15._attr = local_310._attr;
    iVar10 = *piVar19;
    *piVar19 = 0;
    dVar27 = strtod((char *)local_310._attr,(char **)local_2b8);
    if ((xml_attribute_struct *)local_2b8._0_8_ == xVar15._attr) goto LAB_001094d4;
    if (*piVar19 == 0) {
LAB_0010902b:
      *piVar19 = iVar10;
    }
    else if (*piVar19 == 0x22) {
      dVar27 = (double)std::__throw_out_of_range("stod");
      goto LAB_0010902b;
    }
    this->nang = dVar27;
    if ((xml_node_struct *)local_310._attr != (xml_node_struct *)local_300) {
      operator_delete(local_310._attr,local_300._0_8_ + 1);
    }
    local_2e0 = pugi::xml_node::attribute(&local_290,"b");
    pcVar17 = pugi::xml_attribute::value(&local_2e0);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_310,pcVar17,(allocator<char> *)&local_2e8);
    xVar15._attr = local_310._attr;
    iVar10 = *piVar19;
    *piVar19 = 0;
    dVar27 = strtod((char *)local_310._attr,(char **)local_2b8);
    if ((xml_attribute_struct *)local_2b8._0_8_ == xVar15._attr) goto LAB_001094e0;
    if (*piVar19 == 0) {
LAB_001090c6:
      *piVar19 = iVar10;
    }
    else if (*piVar19 == 0x22) {
      dVar27 = (double)std::__throw_out_of_range("stod");
      goto LAB_001090c6;
    }
    this->nanb = dVar27;
    if ((xml_node_struct *)local_310._attr != (xml_node_struct *)local_300) {
      operator_delete(local_310._attr,local_300._0_8_ + 1);
    }
    if ((xml_node_struct *)local_2d8._0_8_ != (xml_node_struct *)(local_2d8 + 0x10)) {
      operator_delete((void *)local_2d8._0_8_,(ulong)((long)(uintptr_t *)local_2d8._16_8_ + 1));
    }
    pugi::xml_document::~xml_document((xml_document *)local_238);
LAB_00109122:
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"NaN RGB = ",10);
    std::ostream::_M_insert<double>(*local_270);
    std::ostream::_M_insert<double>(this->nang);
    poVar11 = std::ostream::_M_insert<double>(this->nanb);
    std::__ostream_insert<char,std::char_traits<char>>(poVar11,"\n",1);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,"Colormap space = ",0x11);
    poVar11 = std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)&std::cout,(this->space)._M_dataplus._M_p,
                         (this->space)._M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>(poVar11,"\n",1);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,"Number of interpolation points = ",0x21);
    poVar11 = std::ostream::_M_insert<unsigned_long>((ulong)&std::cout);
    std::__ostream_insert<char,std::char_traits<char>>(poVar11,"\n",1);
    std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + 'H');
    std::ostream::put('H');
    std::ostream::flush();
    sortidx<double>((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_238,&this->x);
    local_2d8._0_8_ = (xml_node_struct *)0x0;
    local_2d8._8_8_ = (object_t *)0x0;
    local_2d8._16_8_ = (xml_attribute_struct *)0x0;
    std::vector<double,_std::allocator<double>_>::operator=
              ((vector<double,_std::allocator<double>_> *)local_2d8,&this->x);
    pdVar3 = (this->x).super__Vector_base<double,_std::allocator<double>_>._M_impl.
             super__Vector_impl_data._M_start;
    lVar24 = (long)(this->x).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                   super__Vector_impl_data._M_finish - (long)pdVar3;
    if (lVar24 != 0) {
      lVar24 = lVar24 >> 3;
      lVar25 = 0;
      do {
        pdVar3[lVar25] =
             (double)((uintptr_t *)local_2d8._0_8_)
                     [*(uint *)((long)(uintptr_t *)local_238._0_8_ + lVar25 * 4)];
        lVar25 = lVar25 + 1;
      } while (lVar24 + (ulong)(lVar24 == 0) != lVar25);
    }
    std::vector<double,_std::allocator<double>_>::operator=
              ((vector<double,_std::allocator<double>_> *)local_2d8,local_278);
    pdVar3 = (this->r).super__Vector_base<double,_std::allocator<double>_>._M_impl.
             super__Vector_impl_data._M_start;
    lVar24 = (long)(this->r).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                   super__Vector_impl_data._M_finish - (long)pdVar3;
    if (lVar24 != 0) {
      lVar24 = lVar24 >> 3;
      lVar25 = 0;
      do {
        pdVar3[lVar25] =
             (double)((uintptr_t *)local_2d8._0_8_)
                     [*(uint *)((long)(uintptr_t *)local_238._0_8_ + lVar25 * 4)];
        lVar25 = lVar25 + 1;
      } while (lVar24 + (ulong)(lVar24 == 0) != lVar25);
    }
    std::vector<double,_std::allocator<double>_>::operator=
              ((vector<double,_std::allocator<double>_> *)local_2d8,local_280);
    pdVar3 = (this->g).super__Vector_base<double,_std::allocator<double>_>._M_impl.
             super__Vector_impl_data._M_start;
    lVar24 = (long)(this->g).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                   super__Vector_impl_data._M_finish - (long)pdVar3;
    if (lVar24 != 0) {
      lVar24 = lVar24 >> 3;
      lVar25 = 0;
      do {
        pdVar3[lVar25] =
             (double)((uintptr_t *)local_2d8._0_8_)
                     [*(uint *)((long)(uintptr_t *)local_238._0_8_ + lVar25 * 4)];
        lVar25 = lVar25 + 1;
      } while (lVar24 + (ulong)(lVar24 == 0) != lVar25);
    }
    std::vector<double,_std::allocator<double>_>::operator=
              ((vector<double,_std::allocator<double>_> *)local_2d8,local_288);
    pdVar3 = (this->b).super__Vector_base<double,_std::allocator<double>_>._M_impl.
             super__Vector_impl_data._M_start;
    lVar24 = (long)(this->b).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                   super__Vector_impl_data._M_finish - (long)pdVar3;
    if (lVar24 != 0) {
      lVar24 = lVar24 >> 3;
      lVar25 = 0;
      do {
        pdVar3[lVar25] =
             (double)((uintptr_t *)local_2d8._0_8_)
                     [*(uint *)((long)(uintptr_t *)local_238._0_8_ + lVar25 * 4)];
        lVar25 = lVar25 + 1;
      } while (lVar24 + (ulong)(lVar24 == 0) != lVar25);
    }
    pdVar6 = (this->x).super__Vector_base<double,_std::allocator<double>_>._M_impl.
             super__Vector_impl_data._M_start;
    pdVar3 = (this->x).super__Vector_base<double,_std::allocator<double>_>._M_impl.
             super__Vector_impl_data._M_finish;
    lVar24 = (long)pdVar3 - (long)pdVar6;
    if (lVar24 != 0) {
      dVar27 = *pdVar6;
      lVar24 = lVar24 >> 3;
      dVar2 = pdVar3[-1];
      lVar25 = 0;
      do {
        pdVar6[lVar25] = (pdVar6[lVar25] - dVar27) / (dVar2 - dVar27);
        lVar25 = lVar25 + 1;
      } while (lVar24 + (ulong)(lVar24 == 0) != lVar25);
    }
    if ((xml_node_struct *)local_2d8._0_8_ != (xml_node_struct *)0x0) {
      operator_delete((void *)local_2d8._0_8_,local_2d8._16_8_ - local_2d8._0_8_);
    }
    if ((xml_node_struct *)local_238._0_8_ != (xml_node_struct *)0x0) {
      operator_delete((void *)local_238._0_8_,local_238._16_8_ - local_238._0_8_);
    }
    bVar9 = true;
  }
  else {
    iVar10 = std::__cxx11::string::compare((char *)&local_258);
    if (iVar10 == 0) {
      std::ifstream::ifstream(local_238,(string *)file,_S_in);
      local_2b8._0_8_ = local_2b8._0_8_ & 0xffffffffffffff00;
      local_2b8._8_8_ = (object_t *)0x0;
      local_300._16_8_ = psVar1;
      nlohmann::
      basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
      ::assert_invariant((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                          *)local_2b8,true);
      nlohmann::
      basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
      ::assert_invariant((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                          *)local_2b8,true);
      nlohmann::operator>>
                ((istream *)local_238,
                 (basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                  *)local_2b8);
      std::ifstream::close();
      uVar26 = 1;
      do {
        uVar13 = (ulong)(uVar26 - 1);
        pvVar12 = nlohmann::
                  basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                  ::operator[]((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                                *)local_2b8,uVar13);
        pvVar12 = nlohmann::
                  basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>
                  ::operator[]<char_const>
                            ((basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>
                              *)pvVar12,"Name");
        local_2d8._0_8_ = local_2d8._0_8_ & 0xffffffffffffff00;
        local_2d8._8_8_ = (object_t *)0x0;
        nlohmann::detail::external_constructor<(nlohmann::detail::value_t)3>::
        construct<nlohmann::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>>
                  ((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                    *)local_2d8,local_298);
        nlohmann::
        basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
        ::assert_invariant((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                            *)local_2d8,true);
        cVar8 = nlohmann::operator==
                          (pvVar12,(basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                                    *)local_2d8);
        nlohmann::
        basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
        ::~basic_json((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                       *)local_2d8);
        if ((bool)cVar8) {
          pvVar12 = nlohmann::
                    basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                    ::operator[]((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                                  *)local_2b8,uVar13);
          pvVar12 = nlohmann::
                    basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>
                    ::operator[]<char_const>
                              ((basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>
                                *)pvVar12,"RGBPoints");
          nlohmann::
          basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
          ::get_impl<std::vector<float,_std::allocator<float>_>,_0>(&local_310,pvVar12);
          if (local_308 != (xml_node_struct *)local_310._attr) {
            uVar26 = 4;
            uVar22 = 0;
            xVar15._attr = local_310._attr;
            do {
              local_2d8._0_8_ =
                   (undefined8)
                   *(float *)((long)&((xml_node_struct *)xVar15._attr)->header + uVar22 * 4);
              iVar4._M_current =
                   (this->x).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                   super__Vector_impl_data._M_finish;
              if (iVar4._M_current ==
                  (this->x).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                  super__Vector_impl_data._M_end_of_storage) {
                std::vector<double,_std::allocator<double>_>::_M_realloc_insert<double>
                          (&this->x,iVar4,(double *)local_2d8);
                xVar15._attr = local_310._attr;
              }
              else {
                *iVar4._M_current = (double)local_2d8._0_8_;
                (this->x).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                super__Vector_impl_data._M_finish = iVar4._M_current + 1;
              }
              local_2d8._0_8_ =
                   (undefined8)
                   *(float *)((long)&((xml_node_struct *)xVar15._attr)->header +
                             (ulong)(uVar26 - 3) * 4);
              iVar4._M_current =
                   (this->r).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                   super__Vector_impl_data._M_finish;
              if (iVar4._M_current ==
                  (this->r).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                  super__Vector_impl_data._M_end_of_storage) {
                std::vector<double,_std::allocator<double>_>::_M_realloc_insert<double>
                          (local_278,iVar4,(double *)local_2d8);
                xVar15._attr = local_310._attr;
              }
              else {
                *iVar4._M_current = (double)local_2d8._0_8_;
                (this->r).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                super__Vector_impl_data._M_finish = iVar4._M_current + 1;
              }
              local_2d8._0_8_ =
                   (undefined8)
                   *(float *)((long)&((xml_node_struct *)xVar15._attr)->header +
                             (ulong)(uVar26 - 2) * 4);
              iVar4._M_current =
                   (this->g).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                   super__Vector_impl_data._M_finish;
              if (iVar4._M_current ==
                  (this->g).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                  super__Vector_impl_data._M_end_of_storage) {
                std::vector<double,_std::allocator<double>_>::_M_realloc_insert<double>
                          (local_280,iVar4,(double *)local_2d8);
                xVar15._attr = local_310._attr;
              }
              else {
                *iVar4._M_current = (double)local_2d8._0_8_;
                (this->g).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                super__Vector_impl_data._M_finish = iVar4._M_current + 1;
              }
              local_2d8._0_8_ =
                   (undefined8)
                   *(float *)((long)&((xml_node_struct *)xVar15._attr)->header +
                             (ulong)(uVar26 - 1) * 4);
              iVar4._M_current =
                   (this->b).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                   super__Vector_impl_data._M_finish;
              if (iVar4._M_current ==
                  (this->b).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                  super__Vector_impl_data._M_end_of_storage) {
                std::vector<double,_std::allocator<double>_>::_M_realloc_insert<double>
                          (local_288,iVar4,(double *)local_2d8);
                xVar15._attr = local_310._attr;
              }
              else {
                *iVar4._M_current = (double)local_2d8._0_8_;
                (this->b).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                super__Vector_impl_data._M_finish = iVar4._M_current + 1;
              }
              uVar22 = (ulong)uVar26;
              uVar26 = uVar26 + 4;
            } while (uVar22 < (ulong)((long)local_308 - (long)xVar15._attr >> 2));
          }
          pvVar12 = nlohmann::
                    basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                    ::operator[]((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                                  *)local_2b8,uVar13);
          pvVar12 = nlohmann::
                    basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>
                    ::operator[]<char_const>
                              ((basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>
                                *)pvVar12,"ColorSpace");
          nlohmann::
          basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
          ::
          get_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_0>
                    (local_2d8,pvVar12);
          std::__cxx11::string::operator=((string *)local_300._16_8_,(string *)local_2d8);
          if ((xml_node_struct *)local_2d8._0_8_ != (xml_node_struct *)(local_2d8 + 0x10)) {
            operator_delete((void *)local_2d8._0_8_,(ulong)((long)(uintptr_t *)local_2d8._16_8_ + 1)
                           );
          }
          pvVar12 = nlohmann::
                    basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                    ::operator[]((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                                  *)local_2b8,uVar13);
          if ((pvVar12->m_type == object) &&
             (cVar16 = std::
                       _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,nlohmann::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>>,std::_Select1st<std::pair<std::__cxx11::string_const,nlohmann::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>>>,std::less<void>,std::allocator<std::pair<std::__cxx11::string_const,nlohmann::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>>>>
                       ::_M_find_tr<char[9],void>
                                 ((_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,nlohmann::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>>,std::_Select1st<std::pair<std::__cxx11::string_const,nlohmann::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>>>,std::less<void>,std::allocator<std::pair<std::__cxx11::string_const,nlohmann::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>>>>
                                   *)(pvVar12->m_value).object,(char (*) [9])"NanColor"),
             (_Rb_tree_header *)cVar16._M_node !=
             &(((pvVar12->m_value).object)->_M_t)._M_impl.super__Rb_tree_header)) {
            pvVar12 = nlohmann::
                      basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                      ::operator[]((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                                    *)local_2b8,uVar13);
            pvVar12 = nlohmann::
                      basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>
                      ::operator[]<char_const>
                                ((basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>
                                  *)pvVar12,"NanColor");
            nlohmann::
            basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
            ::get_impl<std::vector<float,_std::allocator<float>_>,_0>(local_2d8,pvVar12);
            dVar27 = (double)(float)*(uintptr_t *)local_2d8._0_8_;
            dVar2 = (double)(float)(*(uintptr_t *)local_2d8._0_8_ >> 0x20);
            auVar7._8_4_ = SUB84(dVar2,0);
            auVar7._0_8_ = dVar27;
            auVar7._12_4_ = (int)((ulong)dVar2 >> 0x20);
            this->nanr = dVar27;
            this->nang = (double)auVar7._8_8_;
            this->nanb = (double)*(float *)(local_2d8._0_8_ + 8);
            operator_delete((void *)local_2d8._0_8_,local_2d8._16_8_ - local_2d8._0_8_);
          }
          goto LAB_001089a9;
        }
        if (local_2b8[0] == object) {
          uVar13 = (((_Rep_type *)local_2b8._8_8_)->_M_impl).super__Rb_tree_header._M_node_count;
        }
        else if (local_2b8[0] == array) {
          uVar13 = (long)(((_Vector_base<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>,_std::allocator<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>_>
                            *)local_2b8._8_8_)->_M_impl).super__Vector_impl_data._M_finish -
                   (long)(((_Vector_base<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>,_std::allocator<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>_>
                            *)local_2b8._8_8_)->_M_impl).super__Vector_impl_data._M_start >> 4;
        }
        else {
          uVar13 = 1;
          if (local_2b8[0] == null) break;
        }
        uVar22 = (ulong)uVar26;
        uVar26 = uVar26 + 1;
      } while (uVar22 < uVar13);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cout,"\nError:  cannot find colormap name \"",0x24);
      poVar11 = std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)&std::cout,(local_298->_M_dataplus)._M_p,
                           local_298->_M_string_length);
      std::__ostream_insert<char,std::char_traits<char>>(poVar11,"\".",2);
      std::ios::widen((char)*(undefined8 *)(*(long *)poVar11 + -0x18) + (char)poVar11);
      std::ostream::put((char)poVar11);
      std::ostream::flush();
LAB_001089c0:
      nlohmann::
      basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
      ::~basic_json((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                     *)local_2b8);
      std::ifstream::~ifstream(local_238);
      local_300._16_4_ = 0xfffffffe;
      if (cVar8 != '\0') goto LAB_00109122;
    }
    else {
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cout,"\nError:  unknown colormap file extension \".",0x2b);
      poVar11 = std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)&std::cout,(char *)local_258,local_250);
      std::__ostream_insert<char,std::char_traits<char>>(poVar11,"\".",2);
      std::ios::widen((char)*(undefined8 *)(*(long *)poVar11 + -0x18) + (char)poVar11);
      std::ostream::put((char)poVar11);
      std::ostream::flush();
      local_300._16_4_ = 0xfffffffa;
    }
LAB_0010970d:
    bVar9 = false;
  }
  if (local_258 != local_248) {
    operator_delete(local_258,local_248[0] + 1);
  }
  if (bVar9) {
    return 0;
  }
  return local_300._16_4_;
}

Assistant:

int load(std::string file, std::string name)
	{ try {
		x.clear();
		r.clear();
		g.clear();
		b.clear();
		nanr = 0;
		nang = 0;
		nanb = 0;
		space = "RGB";
		paraView = true;

		std::string ext = file.substr(file.find_last_of(".") + 1);
		if (ext == "xml")
		{
			pugi::xml_document doc;
			if (int io = loadXml(file, doc) != 0)
				return io;

			std::string xquery;
			pugi::xpath_node point0;
			try
			{
				xquery = "/ColorMaps/ColorMap[@name='" + name + "']/Point";
				point0 = doc.select_node(xquery.c_str());
				if (!point0) throw xPathException;
				//std::cout << "point0 = " << point0.node().first_attribute().value() << "\n";
				space = point0.node().parent().attribute("space").value();
				for (pugi::xml_node point = point0.node(); point; point = point.next_sibling("Point"))
				{
					//std::cout << "b = " << point.attribute("b").value() << std::endl;
					x.push_back(std::stod(point.attribute("x").value()));
					r.push_back(std::stod(point.attribute("r").value()));
					g.push_back(std::stod(point.attribute("g").value()));
					b.push_back(std::stod(point.attribute("b").value()));
				}
			}
			catch (const std::exception& e)
			{
				std::cout << "\nError:  cannot parse colormap \"" << name << "\"." << std::endl;
				std::cout << e.what() << std::endl;
				return ERR_XML_PARSE;
			}

			try
			{
				xquery = "/ColorMaps/ColorMap[@name='" + name + "']/NaN";
				point0 = doc.select_node(xquery.c_str());
				if (!point0) throw xPathException;
				pugi::xml_node nan = point0.node();
				nanr = std::stod(nan.attribute("r").value());
				nang = std::stod(nan.attribute("g").value());
				nanb = std::stod(nan.attribute("b").value());
			}
			catch (const std::exception& e)
			{
				// Do nothing.  Use default NaN color.
			}
		}
		else if (ext == "json")
		{
			std::ifstream ifs(file);
			json inj;

			try
			{
				ifs >> inj;
				ifs.close();  // close to release lock on file
			}
			catch (const std::exception& e)
			{
				std::cout << "\nError:  cannot load JSON colormap file \"" << file << "\"." << std::endl;
				std::cout << e.what() << std::endl;
				return ERR_JSON;
			}

			//std::cout << "Input JSON =\n" << std::setw(4) << inj << "\n" << std::endl;

			unsigned int i = 0;
			while (inj[i]["Name"] != name)
			{
				i++;
				if (i >= inj.size())
				{
					std::cout << "\nError:  cannot find colormap name \"" << name << "\"." << std::endl;
					return ERR_JSON;
				}
			}

			//std::string name0 = inj[i]["Name"];
			//std::cout << "name0 = " << name0 << std::endl;

			std::vector<float> xrgb = inj[i]["RGBPoints"];
			//std::cout << "xrgb = " << xrgb << std::endl;
			for (unsigned int j = 0; j < xrgb.size();)
			{
				x.push_back(xrgb[j++]);
				r.push_back(xrgb[j++]);
				g.push_back(xrgb[j++]);
				b.push_back(xrgb[j++]);
			}

			space = inj[i]["ColorSpace"];

			if (inj[i].contains("NanColor"))
			{
				//std::cout << "contains NanColor\n\n";

				try
				{
					std::vector<float> nan = inj[i]["NanColor"];
					nanr = nan[0];
					nang = nan[1];
					nanb = nan[2];
				}
				catch (const nlohmann::detail::type_error& e)
				{
				}
				catch (const std::exception& e)
				{
					// Do nothing.  Use default NaN color.
				}
			}
			//else
			//{
			//	std::cout << "does not contain NanColor\n\n";
			//}

		}
		else
		{
			std::cout << "\nError:  unknown colormap file extension \"." << ext << "\"." << std::endl;
			return ERR_FILETYPE;
		}

		std::cout << "NaN RGB = " << nanr << nang << nanb << "\n";
		std::cout << "Colormap space = " << space << "\n";
		std::cout << "Number of interpolation points = " << x.size() << "\n";
		std::cout << std::endl;

		// Sort by x.
		auto idxc = sortidx(x);
		std::vector<double> tmp;
		tmp = x;
		for (int i = 0; i < x.size(); i++)
			x[i] = tmp[idxc[i]];
		tmp = r;
		for (int i = 0; i < r.size(); i++)
			r[i] = tmp[idxc[i]];
		tmp = g;
		for (int i = 0; i < g.size(); i++)
			g[i] = tmp[idxc[i]];
		tmp = b;
		for (int i = 0; i < b.size(); i++)
			b[i] = tmp[idxc[i]];

		// Map x to range [0, 1], since some XMLs use [-1, 1] instead.
		auto cxmin = x[0];
		auto cxmax = x[x.size() - 1];
		for (int i = 0; i < x.size(); i++)
			x[i] = (x[i] - cxmin) / (cxmax - cxmin);

		//std::cout << "Color map:\n";
		//for (int i = 0; i < x.size(); i++)
		//{
		//	std::cout << "x = " << x[i] << ", r = " << r[i]
		//	        << ", g = " << g[i] << ", b = " << b[i] << "\n";
		//}

		}
		catch (const nlohmann::detail::type_error& e)
		{
		}
		catch (const std::exception& e)
		{
			// Do nothing.  Use default NaN color.
		}

		return 0;
	}